

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DescriptorSetAllocator::FreeDescriptorSet
          (DescriptorSetAllocator *this,VkDescriptorSet Set,VkDescriptorPool Pool,Uint64 QueueMask)

{
  RenderDeviceVkImpl *this_00;
  DescriptorSetDeleter local_40;
  Uint64 local_28;
  Uint64 QueueMask_local;
  VkDescriptorPool Pool_local;
  VkDescriptorSet Set_local;
  DescriptorSetAllocator *this_local;
  
  this_00 = (this->super_DescriptorPoolManager).m_DeviceVkImpl;
  local_28 = QueueMask;
  QueueMask_local = (Uint64)Pool;
  Pool_local = (VkDescriptorPool)Set;
  Set_local = (VkDescriptorSet)this;
  FreeDescriptorSet(VkDescriptorSet_T*,VkDescriptorPool_T*,unsigned_long)::DescriptorSetDeleter::
  DescriptorSetDeleter(Diligent::DescriptorSetAllocator__VkDescriptorSet_T__VkDescriptorPool_T__
            (&local_40,this,Set,Pool);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  SafeReleaseDeviceObject<Diligent::DescriptorSetAllocator::FreeDescriptorSet(VkDescriptorSet_T*,VkDescriptorPool_T*,unsigned_long)::DescriptorSetDeleter,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this_00,&local_40,local_28);
  FreeDescriptorSet::DescriptorSetDeleter::~DescriptorSetDeleter(&local_40);
  return;
}

Assistant:

void DescriptorSetAllocator::FreeDescriptorSet(VkDescriptorSet Set, VkDescriptorPool Pool, Uint64 QueueMask)
{
    class DescriptorSetDeleter
    {
    public:
        // clang-format off
        DescriptorSetDeleter(DescriptorSetAllocator& _Allocator,
                             VkDescriptorSet         _Set,
                             VkDescriptorPool        _Pool) :
            Allocator {&_Allocator},
            Set       {_Set       },
            Pool      {_Pool      }
        {}

        DescriptorSetDeleter             (const DescriptorSetDeleter&) = delete;
        DescriptorSetDeleter& operator = (const DescriptorSetDeleter&) = delete;
        DescriptorSetDeleter& operator = (      DescriptorSetDeleter&&)= delete;

        DescriptorSetDeleter(DescriptorSetDeleter&& rhs)noexcept :
            Allocator {rhs.Allocator},
            Set       {rhs.Set      },
            Pool      {rhs.Pool     }
        {
            rhs.Allocator = nullptr;
            rhs.Set       = VK_NULL_HANDLE;
            rhs.Pool      = VK_NULL_HANDLE;
        }
        // clang-format on

        ~DescriptorSetDeleter()
        {
            if (Allocator != nullptr)
            {
                std::lock_guard<std::mutex> Lock{Allocator->m_Mutex};
                Allocator->m_DeviceVkImpl.GetLogicalDevice().FreeDescriptorSet(Pool, Set);
#ifdef DILIGENT_DEVELOPMENT
                --Allocator->m_AllocatedSetCounter;
#endif
            }
        }

    private:
        DescriptorSetAllocator* Allocator;
        VkDescriptorSet         Set;
        VkDescriptorPool        Pool;
    };
    m_DeviceVkImpl.SafeReleaseDeviceObject(DescriptorSetDeleter{*this, Set, Pool}, QueueMask);
}